

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O0

void ed_scale_base(ed *out,limb_t *x)

{
  limb_t *in_RSI;
  int i;
  uint8_t pack [32];
  sc_t tmp;
  pced P;
  ed R1;
  ed R0;
  int local_21c;
  limb_t local_1f8 [4];
  limb_t *in_stack_fffffffffffffe28;
  uint8_t *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  pced *in_stack_fffffffffffffe80;
  undefined1 local_150 [160];
  pced *in_stack_ffffffffffffff50;
  ed *in_stack_ffffffffffffff58;
  ed *in_stack_ffffffffffffff60;
  ed *in_stack_ffffffffffffff80;
  ed *in_stack_ffffffffffffff88;
  ed *in_stack_ffffffffffffff90;
  
  sc_add(local_1f8,in_RSI,con_off);
  sc_export(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  memcpy(&stack0xffffffffffffff50,&ed_zero,0xa0);
  memcpy(local_150,&ed_zero,0xa0);
  for (local_21c = 0; local_21c < 0x20; local_21c = local_21c + 1) {
    scale16(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    ed_add_pc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    scale16(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    ed_add_pc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  for (local_21c = 0; local_21c < 4; local_21c = local_21c + 1) {
    ed_add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  ed_add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  return;
}

Assistant:

void
ed_scale_base(struct ed *out, const sc_t x)
{
	struct ed R0, R1;
	struct pced P;
	sc_t tmp;
	uint8_t pack[32];
	int i;

	/* s <- x + 8 * (16^64 - 1) / 15 */
	sc_add(tmp, x, con_off);
	sc_export(pack, tmp);

	/*
	 * R0 <- r0*B + r2*16^2*B + ... + r62*16^62*B 
	 * R1 <- r1*B + r3*16^2*B + ... + r63*16^62*B
	 */
	memcpy(&R0, &ed_zero, sizeof(struct ed));
	memcpy(&R1, &ed_zero, sizeof(struct ed));
	for (i = 0; i < 32; i++) {
		scale16(&P, 2*i, (pack[i] & 0xf) - 8);
		ed_add_pc(&R0, &R0, &P);

		scale16(&P, 2*i, (pack[i] >> 4) - 8);
		ed_add_pc(&R1, &R1, &P);
	}

	/* R1 <- 16 * R1 */
	for (i = 0; i < 4; i++)
		ed_add(&R1, &R1, &R1);

	/* out <- R0 + R1 */
	ed_add(out, &R0, &R1);
}